

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

bool __thiscall
crnd::static_huffman_data_model::prepare_decoder_tables(static_huffman_data_model *this)

{
  uint uVar1;
  uint32 uVar2;
  int iVar3;
  decoder_tables *pdVar4;
  uint32 total_syms;
  static_huffman_data_model *this_local;
  
  uVar2 = vector<unsigned_char>::size(&this->m_code_sizes);
  this->m_total_syms = uVar2;
  if (this->m_pDecode_tables == (decoder_tables *)0x0) {
    pdVar4 = crnd_new<crnd::prefix_coding::decoder_tables>();
    this->m_pDecode_tables = pdVar4;
  }
  pdVar4 = this->m_pDecode_tables;
  uVar1 = this->m_total_syms;
  vector<unsigned_char>::operator[](&this->m_code_sizes,0);
  compute_decoder_table_bits(this);
  iVar3 = prefix_coding::decoder_tables::init(pdVar4,(EVP_PKEY_CTX *)(ulong)uVar1);
  return (bool)((byte)iVar3 & 1);
}

Assistant:

bool static_huffman_data_model::prepare_decoder_tables()
    {
        uint32 total_syms = m_code_sizes.size();

        CRND_ASSERT((total_syms >= 1) && (total_syms <= prefix_coding::cMaxSupportedSyms));

        m_total_syms = total_syms;

        if (!m_pDecode_tables)
            m_pDecode_tables = crnd_new<prefix_coding::decoder_tables>();

        return m_pDecode_tables->init(m_total_syms, &m_code_sizes[0], compute_decoder_table_bits());
    }